

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_get_frame_flags(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  char cVar1;
  uint *puVar2;
  long lVar3;
  undefined8 *puVar4;
  uint uVar5;
  
  uVar5 = args->gp_offset;
  if ((ulong)uVar5 < 0x29) {
    puVar4 = (undefined8 *)((ulong)uVar5 + (long)args->reg_save_area);
    args->gp_offset = uVar5 + 8;
  }
  else {
    puVar4 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar4 + 1;
  }
  puVar2 = (uint *)*puVar4;
  if (puVar2 != (uint *)0x0) {
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      lVar3 = *ctx->frame_worker->data1;
      *puVar2 = 0;
      cVar1 = *(char *)(lVar3 + 0x3b60);
      if (cVar1 == '\x03') {
        *puVar2 = 0x20;
        uVar5 = 0x60;
      }
      else if (cVar1 == '\x02') {
        *puVar2 = 0x10;
        uVar5 = 0x50;
      }
      else {
        uVar5 = 0x40;
        if (cVar1 == '\0') {
          *puVar2 = 0x11;
          uVar5 = (uint)(*(int *)(lVar3 + 0x3d40) == 0) * 0x80;
          *puVar2 = uVar5 + 0x11;
          uVar5 = uVar5 | 0x51;
        }
      }
      if (*(char *)(lVar3 + 0x3d56) == '\x01') {
        *puVar2 = uVar5;
      }
      return AOM_CODEC_OK;
    }
    return AOM_CODEC_ERROR;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_get_frame_flags(aom_codec_alg_priv_t *ctx,
                                            va_list args) {
  int *const arg = va_arg(args, int *);
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  if (ctx->frame_worker == NULL) return AOM_CODEC_ERROR;
  AV1Decoder *pbi = ((FrameWorkerData *)ctx->frame_worker->data1)->pbi;
  *arg = 0;
  switch (pbi->common.current_frame.frame_type) {
    case KEY_FRAME:
      *arg |= AOM_FRAME_IS_KEY;
      *arg |= AOM_FRAME_IS_INTRAONLY;
      if (!pbi->common.show_frame) {
        *arg |= AOM_FRAME_IS_DELAYED_RANDOM_ACCESS_POINT;
      }
      break;
    case INTRA_ONLY_FRAME: *arg |= AOM_FRAME_IS_INTRAONLY; break;
    case S_FRAME: *arg |= AOM_FRAME_IS_SWITCH; break;
  }
  if (pbi->common.features.error_resilient_mode) {
    *arg |= AOM_FRAME_IS_ERROR_RESILIENT;
  }
  return AOM_CODEC_OK;
}